

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O2

shared_ptr<std::out_of_range>
chaiscript::detail::Cast_Helper_Inner<std::shared_ptr<std::out_of_range>_>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  __shared_ptr<std::out_of_range,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<std::out_of_range> sVar2;
  
  p_Var1 = &Any::cast<std::shared_ptr<std::out_of_range>>
                      ((Any *)&(((param_2->m_conversions)._M_data)->m_conversions)._M_t._M_impl.
                               super__Rb_tree_header._M_header._M_parent)->
            super___shared_ptr<std::out_of_range,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<std::out_of_range,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<std::out_of_range,_(__gnu_cxx::_Lock_policy)2> *)ob,p_Var1);
  sVar2.super___shared_ptr<std::out_of_range,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<std::out_of_range,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)ob;
  return (shared_ptr<std::out_of_range>)
         sVar2.super___shared_ptr<std::out_of_range,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto cast(const Boxed_Value &ob, const Type_Conversions_State *) { return ob.get().cast<std::shared_ptr<Result>>(); }